

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_model.h
# Opt level: O0

bool __thiscall
mp::FlatModel<mp::DefaultFlatModelParams>::is_binary_var
          (FlatModel<mp::DefaultFlatModelParams> *this,int v)

{
  bool bVar1;
  bool bVar2;
  undefined4 in_ESI;
  undefined8 in_RDI;
  double dVar3;
  int in_stack_ffffffffffffffdc;
  undefined5 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe5;
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 uVar4;
  undefined1 in_stack_ffffffffffffffe7;
  int v_00;
  undefined4 in_stack_fffffffffffffff0;
  
  v_00 = (int)((ulong)in_RDI >> 0x20);
  dVar3 = lb((FlatModel<mp::DefaultFlatModelParams> *)
             CONCAT17(in_stack_ffffffffffffffe7,
                      CONCAT16(in_stack_ffffffffffffffe6,
                               CONCAT15(in_stack_ffffffffffffffe5,in_stack_ffffffffffffffe0))),
             in_stack_ffffffffffffffdc);
  if ((dVar3 == 0.0) && (!NAN(dVar3))) {
    dVar3 = ub((FlatModel<mp::DefaultFlatModelParams> *)
               CONCAT17(in_stack_ffffffffffffffe7,
                        CONCAT16(in_stack_ffffffffffffffe6,
                                 CONCAT15(in_stack_ffffffffffffffe5,in_stack_ffffffffffffffe0))),
               in_stack_ffffffffffffffdc);
    if ((dVar3 == 1.0) && (!NAN(dVar3))) {
      bVar1 = is_integer_var((FlatModel<mp::DefaultFlatModelParams> *)
                             CONCAT17(in_stack_ffffffffffffffe7,
                                      CONCAT16(in_stack_ffffffffffffffe6,
                                               CONCAT15(in_stack_ffffffffffffffe5,
                                                        in_stack_ffffffffffffffe0))),
                             in_stack_ffffffffffffffdc);
      in_stack_ffffffffffffffe7 = 1;
      if (bVar1) {
        return true;
      }
    }
  }
  bVar2 = is_fixed((FlatModel<mp::DefaultFlatModelParams> *)
                   CONCAT44(in_ESI,in_stack_fffffffffffffff0),v_00);
  uVar4 = false;
  bVar1 = (bool)uVar4;
  if (bVar2) {
    dVar3 = fixed_value((FlatModel<mp::DefaultFlatModelParams> *)
                        CONCAT17(in_stack_ffffffffffffffe7,
                                 (uint7)CONCAT15(in_stack_ffffffffffffffe5,in_stack_ffffffffffffffe0
                                                )),in_stack_ffffffffffffffdc);
    if ((dVar3 != 0.0) || (bVar1 = true, NAN(dVar3))) {
      dVar3 = fixed_value((FlatModel<mp::DefaultFlatModelParams> *)
                          CONCAT17(in_stack_ffffffffffffffe7,
                                   CONCAT16(uVar4,CONCAT15(1,in_stack_ffffffffffffffe0))),
                          in_stack_ffffffffffffffdc);
      bVar1 = dVar3 == 1.0;
    }
  }
  return bVar1;
}

Assistant:

bool is_binary_var(int v) const {
    return
        (0.0==lb(v) && 1.0==ub(v) && is_integer_var(v))
        || (is_fixed(v)
            && (0.0==fixed_value(v) || 1.0==fixed_value(v)));
  }